

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_TestShell::
createTest(TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_TestShell
           *this)

{
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test *this_00;
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_TestShell
  *this_local;
  
  this_00 = (TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test *
            )operator_new(0x28,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                          ,0x184);
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test::
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<testsuite errors=\"0\" failures=\"0\" hostname=\"localhost\" name=\"groupname\" tests=\"1\" time=\"0.000\" timestamp=\"1978-10-03T00:00:00\">\n", outputFile->line(2));
    STRCMP_EQUAL("</testsuite>\n", outputFile->lineFromTheBack(1));
}